

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

word Extra_Truth6MinimumHeuristic(word t)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int k;
  ulong *puVar9;
  int k_2;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  word wVar13;
  word wVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  
  uVar1 = (t >> 1 & 0x5555555555555555) + (t & 0x5555555555555555);
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (uVar1 >> 4 & 0x707070707070707) + (uVar1 & 0x707070707070707);
  uVar1 = (uVar1 >> 8 & 0xf000f000f000f) + (uVar1 & 0xf000f000f000f);
  lVar2 = (uVar1 >> 0x10 & 0x1f0000001f) + (uVar1 & 0x1f0000001f);
  uVar7 = (int)((ulong)lVar2 >> 0x20) + (int)lVar2;
  if (uVar7 < 0x20) {
    iVar8 = 0;
    do {
      lVar2 = 4;
      puVar9 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar1 = t;
      do {
        uVar15 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar17 = ~uVar15;
        bVar5 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar4 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8 + 8);
        uVar3 = (uVar15 & uVar1) >> (bVar5 & 0x3f) | (uVar1 & uVar17) << (bVar5 & 0x3f);
        if (uVar1 < uVar3) {
          uVar3 = uVar1;
        }
        bVar6 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar10 = (uVar4 & uVar1) >> (bVar6 & 0x3f) | (uVar1 & ~uVar4) << (bVar6 & 0x3f);
        if (uVar10 <= uVar3) {
          uVar3 = uVar10;
        }
        uVar10 = (uVar10 & uVar15) >> (bVar5 & 0x3f) | (uVar10 & uVar17) << (bVar5 & 0x3f);
        if (uVar3 < uVar10) {
          uVar10 = uVar3;
        }
        uVar3 = (*puVar9 & uVar1) >> (bVar5 & 0x3f) |
                (puVar9[-1] & uVar1) << (bVar5 & 0x3f) | puVar9[-2] & uVar1;
        if (uVar3 <= uVar10) {
          uVar10 = uVar3;
        }
        uVar12 = (uVar3 & uVar15) >> (bVar5 & 0x3f) | (uVar3 & uVar17) << (bVar5 & 0x3f);
        if (uVar10 < uVar12) {
          uVar12 = uVar10;
        }
        uVar4 = (uVar3 & uVar4) >> (bVar6 & 0x3f) | (~uVar4 & uVar3) << (bVar6 & 0x3f);
        if (uVar4 <= uVar12) {
          uVar12 = uVar4;
        }
        uVar4 = (uVar4 & uVar15) >> (bVar5 & 0x3f) | (uVar17 & uVar4) << (bVar5 & 0x3f);
        if (uVar12 < uVar4) {
          uVar4 = uVar12;
        }
        if (uVar1 < uVar4) {
          uVar4 = uVar1;
        }
        puVar9 = puVar9 + -3;
        bVar18 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar1 = uVar4;
      } while (bVar18);
    } while ((t != uVar4) && (iVar8 = iVar8 + 1, t = uVar4, iVar8 != 10));
  }
  else if (uVar7 == 0x20) {
    iVar8 = 0;
    wVar13 = t;
    do {
      lVar2 = 4;
      puVar9 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      wVar14 = wVar13;
      do {
        uVar1 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar3 = ~uVar1;
        bVar5 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar15 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8 + 8);
        uVar4 = (uVar1 & wVar14) >> (bVar5 & 0x3f) | (wVar14 & uVar3) << (bVar5 & 0x3f);
        if (wVar14 < uVar4) {
          uVar4 = wVar14;
        }
        bVar6 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar17 = (uVar15 & wVar14) >> (bVar6 & 0x3f) | (wVar14 & ~uVar15) << (bVar6 & 0x3f);
        if (uVar17 <= uVar4) {
          uVar4 = uVar17;
        }
        uVar17 = (uVar17 & uVar1) >> (bVar5 & 0x3f) | (uVar17 & uVar3) << (bVar5 & 0x3f);
        if (uVar4 < uVar17) {
          uVar17 = uVar4;
        }
        uVar4 = (*puVar9 & wVar14) >> (bVar5 & 0x3f) |
                (puVar9[-1] & wVar14) << (bVar5 & 0x3f) | puVar9[-2] & wVar14;
        if (uVar4 <= uVar17) {
          uVar17 = uVar4;
        }
        uVar10 = (uVar4 & uVar1) >> (bVar5 & 0x3f) | (uVar4 & uVar3) << (bVar5 & 0x3f);
        if (uVar17 < uVar10) {
          uVar10 = uVar17;
        }
        uVar15 = (uVar4 & uVar15) >> (bVar6 & 0x3f) | (~uVar15 & uVar4) << (bVar6 & 0x3f);
        if (uVar15 <= uVar10) {
          uVar10 = uVar15;
        }
        uVar1 = (uVar15 & uVar1) >> (bVar5 & 0x3f) | (uVar3 & uVar15) << (bVar5 & 0x3f);
        if (uVar10 < uVar1) {
          uVar1 = uVar10;
        }
        if (wVar14 < uVar1) {
          uVar1 = wVar14;
        }
        puVar9 = puVar9 + -3;
        bVar18 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        wVar14 = uVar1;
      } while (bVar18);
    } while ((wVar13 != uVar1) && (iVar8 = iVar8 + 1, wVar13 = uVar1, iVar8 != 10));
    iVar8 = 0;
    uVar15 = ~t;
    do {
      lVar2 = 4;
      puVar9 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar3 = uVar15;
      do {
        uVar4 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar12 = ~uVar4;
        bVar5 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar17 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8 + 8);
        uVar10 = (uVar4 & uVar3) >> (bVar5 & 0x3f) | (uVar3 & uVar12) << (bVar5 & 0x3f);
        if (uVar3 < uVar10) {
          uVar10 = uVar3;
        }
        bVar6 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar11 = (uVar17 & uVar3) >> (bVar6 & 0x3f) | (uVar3 & ~uVar17) << (bVar6 & 0x3f);
        if (uVar11 <= uVar10) {
          uVar10 = uVar11;
        }
        uVar11 = (uVar11 & uVar4) >> (bVar5 & 0x3f) | (uVar11 & uVar12) << (bVar5 & 0x3f);
        if (uVar10 < uVar11) {
          uVar11 = uVar10;
        }
        uVar10 = (*puVar9 & uVar3) >> (bVar5 & 0x3f) |
                 (puVar9[-1] & uVar3) << (bVar5 & 0x3f) | puVar9[-2] & uVar3;
        if (uVar10 <= uVar11) {
          uVar11 = uVar10;
        }
        uVar16 = (uVar10 & uVar4) >> (bVar5 & 0x3f) | (uVar10 & uVar12) << (bVar5 & 0x3f);
        if (uVar11 < uVar16) {
          uVar16 = uVar11;
        }
        uVar17 = (uVar10 & uVar17) >> (bVar6 & 0x3f) | (~uVar17 & uVar10) << (bVar6 & 0x3f);
        if (uVar17 <= uVar16) {
          uVar16 = uVar17;
        }
        uVar4 = (uVar17 & uVar4) >> (bVar5 & 0x3f) | (uVar12 & uVar17) << (bVar5 & 0x3f);
        if (uVar16 < uVar4) {
          uVar4 = uVar16;
        }
        if (uVar3 < uVar4) {
          uVar4 = uVar3;
        }
        puVar9 = puVar9 + -3;
        bVar18 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar3 = uVar4;
      } while (bVar18);
    } while ((uVar15 != uVar4) && (iVar8 = iVar8 + 1, uVar15 = uVar4, iVar8 != 10));
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
  }
  else {
    iVar8 = 0;
    uVar1 = ~t;
    do {
      lVar2 = 4;
      puVar9 = (ulong *)(Extra_Truth6SwapAdjacent_PMasks + 0x70);
      uVar15 = uVar1;
      do {
        uVar4 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8);
        uVar10 = ~uVar4;
        bVar5 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar3 = *(ulong *)(Extra_Truth6ChangePhase_Truth6 + lVar2 * 8 + 8);
        uVar17 = (uVar4 & uVar15) >> (bVar5 & 0x3f) | (uVar15 & uVar10) << (bVar5 & 0x3f);
        if (uVar15 < uVar17) {
          uVar17 = uVar15;
        }
        bVar6 = (byte)(2 << ((byte)lVar2 & 0x1f));
        uVar12 = (uVar3 & uVar15) >> (bVar6 & 0x3f) | (uVar15 & ~uVar3) << (bVar6 & 0x3f);
        if (uVar12 <= uVar17) {
          uVar17 = uVar12;
        }
        uVar12 = (uVar12 & uVar4) >> (bVar5 & 0x3f) | (uVar12 & uVar10) << (bVar5 & 0x3f);
        if (uVar17 < uVar12) {
          uVar12 = uVar17;
        }
        uVar17 = (*puVar9 & uVar15) >> (bVar5 & 0x3f) |
                 (puVar9[-1] & uVar15) << (bVar5 & 0x3f) | puVar9[-2] & uVar15;
        if (uVar17 <= uVar12) {
          uVar12 = uVar17;
        }
        uVar11 = (uVar17 & uVar4) >> (bVar5 & 0x3f) | (uVar17 & uVar10) << (bVar5 & 0x3f);
        if (uVar12 < uVar11) {
          uVar11 = uVar12;
        }
        uVar3 = (uVar17 & uVar3) >> (bVar6 & 0x3f) | (~uVar3 & uVar17) << (bVar6 & 0x3f);
        if (uVar3 <= uVar11) {
          uVar11 = uVar3;
        }
        uVar4 = (uVar3 & uVar4) >> (bVar5 & 0x3f) | (uVar10 & uVar3) << (bVar5 & 0x3f);
        if (uVar11 < uVar4) {
          uVar4 = uVar11;
        }
        if (uVar15 < uVar4) {
          uVar4 = uVar15;
        }
        puVar9 = puVar9 + -3;
        bVar18 = lVar2 != 0;
        lVar2 = lVar2 + -1;
        uVar15 = uVar4;
      } while (bVar18);
    } while ((uVar1 != uVar4) && (iVar8 = iVar8 + 1, uVar1 = uVar4, iVar8 != 10));
  }
  return uVar4;
}

Assistant:

word Extra_Truth6MinimumHeuristic( word t )
{
    word tMin1, tMin2;
    int nOnes = Extra_Truth6Ones( t );
    if ( nOnes < 32 )
        return Extra_Truth6MinimumRoundMany( t );
    if ( nOnes > 32 )
        return Extra_Truth6MinimumRoundMany( ~t );
    tMin1 = Extra_Truth6MinimumRoundMany(  t );
    tMin2 = Extra_Truth6MinimumRoundMany( ~t );
    return Abc_MinWord( tMin1, tMin2 );
}